

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.hpp
# Opt level: O2

void __thiscall duckdb::Bit::BitToNumeric<int>(Bit *this,bitstring_t bit,int *output_num)

{
  uint8_t uVar1;
  ulong uVar2;
  char *pcVar3;
  undefined4 *puVar4;
  char *pcVar5;
  bitstring_t bit_local;
  
  puVar4 = bit.value._8_8_;
  bit_local.value.pointer.ptr = (char *)bit.value._0_8_;
  *puVar4 = 0;
  pcVar5 = bit_local.value.pointer.ptr;
  if ((uint)this < 0xd) {
    pcVar5 = bit_local.value.pointer.prefix;
  }
  uVar2 = (ulong)this & 0xffffffff;
  bit_local.value._0_8_ = this;
  uVar1 = GetFirstByte(&bit_local);
  pcVar3 = (char *)((long)puVar4 + (uVar2 - 3));
  *(uint8_t *)((long)puVar4 + (uVar2 - 2)) = uVar1;
  pcVar5 = pcVar5 + 2;
  for (uVar2 = 6 - uVar2; uVar2 < 4; uVar2 = uVar2 + 1) {
    *pcVar3 = *pcVar5;
    pcVar5 = pcVar5 + 1;
    pcVar3 = pcVar3 + -1;
  }
  return;
}

Assistant:

void Bit::BitToNumeric(bitstring_t bit, T &output_num) {
	D_ASSERT(bit.GetSize() <= sizeof(T) + 1);

	output_num = 0;
	auto data = const_data_ptr_cast(bit.GetData());
	auto output = data_ptr_cast(&output_num);

	idx_t padded_byte_idx = sizeof(T) - bit.GetSize() + 1;
	output[sizeof(T) - 1 - padded_byte_idx] = GetFirstByte(bit);
	for (idx_t idx = padded_byte_idx + 1; idx < sizeof(T); ++idx) {
		output[sizeof(T) - 1 - idx] = data[1 + idx - padded_byte_idx];
	}
}